

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_ipairs(lua_State *L)

{
  luaL_checkany(L,1);
  lua_pushcclosure(L,ipairsaux,0);
  lua_pushvalue(L,1);
  lua_pushinteger(L,0);
  return 3;
}

Assistant:

static int luaB_ipairs(lua_State *L) {
#if defined(LUA_COMPAT_IPAIRS)
    return pairsmeta(L, "__ipairs", 1, ipairsaux);
#else
    luaL_checkany(L, 1);
    lua_pushcfunction(L, ipairsaux);  /* iteration function */
    lua_pushvalue(L, 1);  /* state */
    lua_pushinteger(L, 0);  /* initial value */
    return 3;
#endif
}